

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m256v_LU_mult(m256v *LU,int *rp,int *cp,m256v *X,m256v *Y_out)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (0 < Y_out->n_row) {
    lVar5 = 0;
    do {
      if (0 < Y_out->n_col) {
        lVar6 = 0;
        do {
          Y_out->e[lVar6 + Y_out->rstride * lVar5] = '\0';
          lVar6 = lVar6 + 1;
        } while (lVar6 < Y_out->n_col);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < Y_out->n_row);
  }
  uVar4 = LU->n_row;
  if (0 < (int)uVar4) {
    lVar5 = 0;
    do {
      if (lVar5 < LU->n_col) {
        iVar2 = rp[lVar5];
        lVar6 = (long)LU->n_col;
        do {
          lVar1 = lVar6 + -1;
          m256v_multadd_row_from
                    (X,cp[lVar6 + -1],0,LU->e[lVar6 + -1 + LU->rstride * lVar5],Y_out,iVar2);
          lVar6 = lVar1;
        } while (lVar5 < lVar1);
      }
      lVar5 = lVar5 + 1;
      uVar4 = LU->n_row;
    } while (lVar5 < (int)uVar4);
  }
  if (0 < (int)uVar4) {
    uVar7 = (ulong)uVar4;
    uVar4 = uVar4 - 2;
    uVar8 = uVar7;
    do {
      uVar7 = uVar7 - 1;
      uVar12 = (ulong)uVar4;
      uVar9 = uVar8 - 1;
      iVar2 = LU->n_col;
      if ((long)iVar2 < (long)uVar8) {
        if (0 < iVar2) {
          lVar5 = (long)iVar2 + 1;
          do {
            m256v_multadd_row_from
                      (Y_out,rp[lVar5 + -2],0,LU->e[lVar5 + -2 + LU->rstride * uVar7],Y_out,
                       rp[uVar9]);
            lVar5 = lVar5 + -1;
          } while (1 < lVar5);
        }
      }
      else if (1 < (long)uVar8) {
        uVar11 = uVar7 & 0xffffffff;
        do {
          m256v_multadd_row_from
                    (Y_out,rp[uVar12],0,LU->e[uVar12 + LU->rstride * uVar7],Y_out,rp[uVar9]);
          uVar12 = uVar12 - 1;
          uVar10 = (int)uVar11 - 1;
          uVar11 = (ulong)uVar10;
        } while (0 < (int)uVar10);
      }
      uVar4 = uVar4 - 1;
      bVar3 = 1 < (long)uVar8;
      uVar8 = uVar9;
    } while (bVar3);
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_mult)(const MV_GEN_TYPE* LU,
		   const int* rp,
		   const int* cp,
		   const MV_GEN_TYPE* X,
		   MV_GEN_TYPE* Y_out)
{
	/* Check dimensions */
	assert(LU->n_col == X->n_row);
	assert(LU->n_row == Y_out->n_row);
	assert(X->n_col == Y_out->n_col);

	/* Clear out the rows in the target vector */
	for (int i = 0; i < Y_out->n_row; ++i) {
		MV_GEN_N(_clear_row)(Y_out, i);
	}

	/* Multiply with U */
	for (int i = 0; i < LU->n_row; ++i) {
		const int t = rp[i];
		for (int j = LU->n_col - 1; j >= i; --j) {
			MV_GEN_N(_multadd_row)(X, cp[j],
					MV_GEN_N(_get_el)(LU, i, j),
					Y_out, t);
		}
	}

	/* Multiply with L */
	for (int i = LU->n_row - 1; i >= 0; --i) {
		if (i >= LU->n_col) {
			/* We're in the rectangle below the triangular part
			 */
			for (int j = LU->n_col - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(Y_out, rp[j],
						MV_GEN_N(_get_el)(LU, i, j),
						Y_out, rp[i]);
			}
		} else {
			/* i < LU->n_col, we're in the triangular part */
			for (int j = i - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(Y_out, rp[j],
						MV_GEN_N(_get_el)(LU, i, j),
						Y_out, rp[i]);
			}
		}
	}
}